

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCheckDupFanin(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,int *piFanin)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  undefined4 local_30;
  undefined4 local_2c;
  int Counter;
  int i;
  Abc_Obj_t *pObj;
  int *piFanin_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  local_30 = 0;
  for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pFanout), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_ObjFanin(pFanout,local_2c);
    if (pAVar2 == pFanin) {
      if (piFanin != (int *)0x0) {
        *piFanin = local_2c;
      }
      local_30 = local_30 + 1;
    }
  }
  return local_30;
}

Assistant:

int Abc_NodeCheckDupFanin( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, int * piFanin )
{
    Abc_Obj_t * pObj;
    int i, Counter = 0;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
        {
            if ( piFanin )
                *piFanin = i;
            Counter++;
        }
    return Counter;
}